

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O2

void __thiscall
JsrtDebugManager::HandleResume
          (JsrtDebugManager *this,InterpreterHaltState *haltState,BREAKRESUMEACTION resumeAction)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  DiagStackFrame **ppDVar5;
  undefined4 extraout_var;
  
  if (resumeAction == BREAKRESUMEACTION_ABORT) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebugManager.cpp"
                       ,0x15a,"(resumeAction != BREAKRESUMEACTION_ABORT)",
                       "resumeAction != BREAKRESUMEACTION_ABORT");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  ppDVar5 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
            Peek(haltState->framePointers,0);
  iVar3 = (*(*ppDVar5)->_vptr_DiagStackFrame[10])();
  Js::StepController::HandleResumeAction
            ((StepController *)
             (*(long *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x3b8) + 0xa0) + 0x1c0),haltState,
             resumeAction);
  return;
}

Assistant:

void JsrtDebugManager::HandleResume(Js::InterpreterHaltState* haltState, BREAKRESUMEACTION resumeAction)
{
    Assert(resumeAction != BREAKRESUMEACTION_ABORT);

    Js::ScriptContext* scriptContext = haltState->framePointers->Peek()->GetScriptContext();

    scriptContext->GetThreadContext()->GetDebugManager()->stepController.HandleResumeAction(haltState, resumeAction);
}